

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Renderer_conflict FT_Lookup_Renderer(FT_Library library,FT_Glyph_Format format,FT_ListNode *node)

{
  FT_Glyph_Format FVar1;
  FT_Renderer_conflict pFVar2;
  FT_Renderer_conflict pFVar3;
  FT_ListNode pFVar4;
  
  if (library == (FT_Library)0x0) {
    return (FT_Renderer_conflict)0x0;
  }
  pFVar4 = (library->renderers).head;
  if (node != (FT_ListNode *)0x0) {
    if (*node != (FT_ListNode)0x0) {
      pFVar4 = (*node)->next;
    }
    *node = (FT_ListNode)0x0;
  }
  pFVar3 = (FT_Renderer_conflict)0x0;
  do {
    if (pFVar4 == (FT_ListNode)0x0) {
      return pFVar3;
    }
    pFVar2 = (FT_Renderer_conflict)pFVar4->data;
    FVar1 = pFVar2->glyph_format;
    if (FVar1 == format) {
      pFVar3 = pFVar2;
      if (node != (FT_ListNode *)0x0) {
        *node = pFVar4;
      }
    }
    else {
      pFVar4 = pFVar4->next;
    }
  } while (FVar1 != format);
  return pFVar3;
}

Assistant:

FT_BASE_DEF( FT_Renderer )
  FT_Lookup_Renderer( FT_Library       library,
                      FT_Glyph_Format  format,
                      FT_ListNode*     node )
  {
    FT_ListNode  cur;
    FT_Renderer  result = NULL;


    if ( !library )
      goto Exit;

    cur = library->renderers.head;

    if ( node )
    {
      if ( *node )
        cur = (*node)->next;
      *node = NULL;
    }

    while ( cur )
    {
      FT_Renderer  renderer = FT_RENDERER( cur->data );


      if ( renderer->glyph_format == format )
      {
        if ( node )
          *node = cur;

        result = renderer;
        break;
      }
      cur = cur->next;
    }

  Exit:
    return result;
  }